

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O3

bool __thiscall argo::pointer::next_token(pointer *this,string *pointer,size_t *start,size_t *end)

{
  ulong uVar1;
  ulong uVar2;
  pointer pcVar3;
  ulong uVar4;
  
  uVar1 = *start;
  uVar2 = pointer->_M_string_length;
  if (uVar1 < uVar2) {
    pcVar3 = (pointer->_M_dataplus)._M_p;
    uVar4 = uVar1;
    do {
      uVar4 = uVar4 + 1;
      *end = uVar4;
      if (pointer->_M_string_length <= uVar4) break;
    } while (pcVar3[uVar4] != '/');
  }
  return uVar1 < uVar2;
}

Assistant:

bool pointer::next_token(const string &pointer, size_t &start, size_t &end)
{
    if (start >= pointer.size())
    {
        return false;
    }
    else
    {
        end = start + 1;

        while (end < pointer.size())
        {
            if (pointer[end] == '/')
            {
                break;
            }
            else
            {
                end++;
            }
        }

        return true;
    }
}